

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::descriptor_unittest::AllowUnknownDependenciesTest_UnknownExtendee_Test::TestBody
          (AllowUnknownDependenciesTest_UnknownExtendee_Test *this)

{
  Descriptor *pDVar1;
  ushort *puVar2;
  undefined1 auVar3 [8];
  bool bVar4;
  FileDescriptor *pFVar5;
  Nonnull<const_char_*> pcVar6;
  Message *in_RCX;
  pointer *__ptr;
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> __ptr_00;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *message;
  pointer pcVar7;
  char *in_R9;
  string_view input;
  FileDescriptorProto extension_proto;
  AssertHelper local_148;
  undefined1 local_140 [8];
  LogMessageData *local_138;
  undefined1 local_130 [8];
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  AssertHelper local_110;
  FileDescriptorProto local_108;
  
  FileDescriptorProto::FileDescriptorProto(&local_108,(Arena *)0x0);
  input._M_str = (char *)&local_108;
  input._M_len = (size_t)
                 "name: \'extension.proto\'extension { extendee: \'UnknownType\' name:\'some_extension\' number:123            label:LABEL_OPTIONAL type:TYPE_INT32 }"
  ;
  bVar4 = TextFormat::ParseFromString((TextFormat *)0x8d,input,in_RCX);
  local_140[0] = (internal)bVar4;
  local_138 = (LogMessageData *)0x0;
  if (bVar4) {
    pFVar5 = AllowUnknownDependenciesTest::BuildFile
                       (&this->super_AllowUnknownDependenciesTest,&local_108);
    auVar3 = local_140;
    local_140[0] = (internal)(pFVar5 != (FileDescriptor *)0x0);
    local_138 = (LogMessageData *)0x0;
    if (pFVar5 == (FileDescriptor *)0x0) {
      testing::Message::Message((Message *)&local_148);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_130,(internal *)local_140,(AssertionResult *)0x10b0e05,"false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_110,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0xe7d,(char *)CONCAT71(local_130._1_7_,local_130[0]));
      testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_148);
      goto LAB_005a03df;
    }
    local_140._4_4_ = auVar3._4_4_;
    local_140._0_4_ = 1;
    local_148.data_._0_4_ = pFVar5->extension_count_;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_130,"1","file->extension_count()",(int *)local_140,
               (int *)&local_148);
    if (local_130[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_140);
      if (local_128._M_head_impl == (LogMessageData *)0x0) {
        pcVar7 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar7 = (pointer)((local_128._M_head_impl)->entry).full_filename_._M_len;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_148,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0xe7f,pcVar7);
      testing::internal::AssertHelper::operator=(&local_148,(Message *)local_140);
LAB_005a067d:
      testing::internal::AssertHelper::~AssertHelper(&local_148);
      if (local_140 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_140 + 8))();
      }
      if (local_128._M_head_impl == (LogMessageData *)0x0) goto LAB_005a07c0;
      this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_128;
      __ptr_00._M_head_impl = local_128._M_head_impl;
    }
    else {
      if (local_128._M_head_impl != (LogMessageData *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_128,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_128._M_head_impl);
      }
      if ((long)pFVar5->extension_count_ < 1) {
        pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                           (0,(long)pFVar5->extension_count_,"index < extension_count()");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_130,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xaec,pcVar6);
        goto LAB_005a084e;
      }
      pDVar1 = pFVar5->extensions_->containing_type_;
      puVar2 = (ushort *)(pDVar1->all_names_).payload_;
      local_140._2_6_ = 0;
      local_140._0_2_ = *puVar2;
      local_138 = (LogMessageData *)((long)puVar2 + ~(ulong)local_140);
      testing::internal::CmpHelperEQ<char[12],std::basic_string_view<char,std::char_traits<char>>>
                ((internal *)local_130,"\"UnknownType\"","extendee->name()",(char (*) [12])0x10ebeba
                 ,(basic_string_view<char,_std::char_traits<char>_> *)local_140);
      if (local_130[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_140);
        if ((__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             )local_128._M_head_impl ==
            (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             )0x0) {
          message = anon_var_dwarf_a22956 + 5;
        }
        else {
          message = *(char **)local_128._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_148,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                   ,0xe81,message);
        testing::internal::AssertHelper::operator=(&local_148,(Message *)local_140);
        testing::internal::AssertHelper::~AssertHelper(&local_148);
        if (local_140 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_140 + 8))();
        }
      }
      if (local_128._M_head_impl != (LogMessageData *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_128,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_128._M_head_impl);
      }
      local_140 = (undefined1  [8])
                  (CONCAT71(local_140._1_7_,pDVar1->field_0x1) & 0xffffffffffffff01);
      local_138 = (LogMessageData *)0x0;
      if ((pDVar1->field_0x1 & 1) == 0) {
        testing::Message::Message((Message *)&local_148);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_130,(internal *)local_140,
                   (AssertionResult *)"extendee->is_placeholder()","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_110,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                   ,0xe82,(char *)CONCAT71(local_130._1_7_,local_130[0]));
        testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_148);
        testing::internal::AssertHelper::~AssertHelper(&local_110);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_130._1_7_,local_130[0]) != &local_120) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_130._1_7_,local_130[0]),
                          local_120._M_allocated_capacity + 1);
        }
        if ((long *)CONCAT44(local_148.data_._4_4_,(int)local_148.data_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_148.data_._4_4_,(int)local_148.data_) + 8))();
        }
        if (local_138 != (LogMessageData *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_138,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_138);
        }
      }
      local_140._0_4_ = 1;
      local_148.data_._0_4_ = pDVar1->extension_range_count_;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_130,"1","extendee->extension_range_count()",(int *)local_140,
                 (int *)&local_148);
      if (local_130[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_140);
        if (local_128._M_head_impl == (LogMessageData *)0x0) {
          pcVar7 = anon_var_dwarf_a22956 + 5;
        }
        else {
          pcVar7 = (pointer)((local_128._M_head_impl)->entry).full_filename_._M_len;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_148,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                   ,0xe83,pcVar7);
        testing::internal::AssertHelper::operator=(&local_148,(Message *)local_140);
        goto LAB_005a067d;
      }
      if (local_128._M_head_impl != (LogMessageData *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_128,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_128._M_head_impl);
      }
      local_148.data_._0_4_ = 1;
      if ((long)pDVar1->extension_range_count_ < 1) {
        pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                           (0,(long)pDVar1->extension_range_count_,"index < extension_range_count()"
                           );
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_130,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xa94,pcVar6);
LAB_005a084e:
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)local_130);
      }
      local_110.data_._0_4_ = pDVar1->extension_ranges_->start_;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_140,"1","extendee->extension_range(0)->start_number()",
                 (int *)&local_148,(int *)&local_110);
      if (local_140[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_130);
        if (local_138 == (LogMessageData *)0x0) {
          pcVar7 = anon_var_dwarf_a22956 + 5;
        }
        else {
          pcVar7 = (pointer)(local_138->entry).full_filename_._M_len;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_148,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                   ,0xe84,pcVar7);
        testing::internal::AssertHelper::operator=(&local_148,(Message *)local_130);
        testing::internal::AssertHelper::~AssertHelper(&local_148);
        if ((long *)CONCAT71(local_130._1_7_,local_130[0]) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(local_130._1_7_,local_130[0]) + 8))();
        }
      }
      if (local_138 != (LogMessageData *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_138,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138)
        ;
      }
      local_148.data_._0_4_ = 0x20000000;
      if ((long)pDVar1->extension_range_count_ < 1) {
        pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                           (0,(long)pDVar1->extension_range_count_,"index < extension_range_count()"
                           );
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_130,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xa94,pcVar6);
        goto LAB_005a084e;
      }
      local_110.data_._0_4_ = pDVar1->extension_ranges_->end_;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_140,"FieldDescriptor::kMaxNumber + 1",
                 "extendee->extension_range(0)->end_number()",(int *)&local_148,(int *)&local_110);
      if (local_140[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_130);
        if (local_138 == (LogMessageData *)0x0) {
          pcVar7 = anon_var_dwarf_a22956 + 5;
        }
        else {
          pcVar7 = (pointer)(local_138->entry).full_filename_._M_len;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_148,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                   ,0xe86,pcVar7);
        testing::internal::AssertHelper::operator=(&local_148,(Message *)local_130);
        testing::internal::AssertHelper::~AssertHelper(&local_148);
        if ((long *)CONCAT71(local_130._1_7_,local_130[0]) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(local_130._1_7_,local_130[0]) + 8))();
        }
      }
      if (local_138 == (LogMessageData *)0x0) goto LAB_005a07c0;
      this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_138;
      __ptr_00._M_head_impl = local_138;
    }
  }
  else {
    testing::Message::Message((Message *)&local_148);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_130,(internal *)local_140,
               (AssertionResult *)
               "TextFormat::ParseFromString( \"name: \'extension.proto\'\" \"extension { extendee: \'UnknownType\' name:\'some_extension\' number:123\" \"            label:LABEL_OPTIONAL type:TYPE_INT32 }\", &extension_proto)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0xe7a,(char *)CONCAT71(local_130._1_7_,local_130[0]));
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_148);
LAB_005a03df:
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_138;
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_130._1_7_,local_130[0]) != &local_120) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_130._1_7_,local_130[0]),local_120._M_allocated_capacity + 1)
      ;
    }
    if ((long *)CONCAT44(local_148.data_._4_4_,(int)local_148.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_148.data_._4_4_,(int)local_148.data_) + 8))();
    }
    __ptr_00._M_head_impl = local_138;
    if (local_138 == (LogMessageData *)0x0) goto LAB_005a07c0;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __ptr_00._M_head_impl);
LAB_005a07c0:
  FileDescriptorProto::~FileDescriptorProto(&local_108);
  return;
}

Assistant:

TEST_P(AllowUnknownDependenciesTest, UnknownExtendee) {
  // Test that we can extend an unknown type.  This is slightly tricky because
  // it means that the placeholder type must have an extension range.

  FileDescriptorProto extension_proto;

  ASSERT_TRUE(TextFormat::ParseFromString(
      "name: 'extension.proto'"
      "extension { extendee: 'UnknownType' name:'some_extension' number:123"
      "            label:LABEL_OPTIONAL type:TYPE_INT32 }",
      &extension_proto));
  const FileDescriptor* file = BuildFile(extension_proto);

  ASSERT_TRUE(file != nullptr);

  ASSERT_EQ(1, file->extension_count());
  const Descriptor* extendee = file->extension(0)->containing_type();
  EXPECT_EQ("UnknownType", extendee->name());
  EXPECT_TRUE(extendee->is_placeholder());
  ASSERT_EQ(1, extendee->extension_range_count());
  EXPECT_EQ(1, extendee->extension_range(0)->start_number());
  EXPECT_EQ(FieldDescriptor::kMaxNumber + 1,
            extendee->extension_range(0)->end_number());
}